

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> * __thiscall
kratos::Simulator::eval_expr
          (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           *__return_storage_ptr__,Simulator *this,Var *var)

{
  _func_int **pp_Var1;
  unsigned_long uVar2;
  uint64_t uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  runtime_error *prVar9;
  Var *pVVar10;
  Var *pVVar11;
  int iVar12;
  undefined1 auVar13 [8];
  optional<unsigned_long> oVar14;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  undefined1 auStack_b8 [8];
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> predicate_val;
  uint64_t local_90;
  undefined1 auStack_88 [8];
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> right_val;
  undefined1 local_58 [8];
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> vars;
  allocator_type local_31;
  
  if (var->type_ != Expression) {
    get_complex_value_(__return_storage_ptr__,this,var);
    return __return_storage_ptr__;
  }
  pp_Var1 = var[1].super_IRNode._vptr_IRNode;
  if (pp_Var1 == (_func_int **)0x1d) {
    pVVar10 = (Var *)var[1].super_IRNode.fn_name_ln.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
    get_complex_value_((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                       local_58,this,pVVar10);
    if ((char)vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == '\0') {
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged = false;
      goto LAB_001e06c0;
    }
    if (var->is_signed_ == true) {
      if (8 < (ulong)((long)vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                            _M_impl.super__Vector_impl_data._M_start - (long)local_58)) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"Not implemented");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pVVar11 = *(Var **)local_58;
      iVar12 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
      if ((ulong)pVVar11 >> ((char)iVar12 - 1U & 0x3f) != 0) {
        for (uVar6 = (*(pVVar10->super_IRNode)._vptr_IRNode[7])(pVVar10);
            uVar7 = (*(var->super_IRNode)._vptr_IRNode[7])(var), uVar6 < uVar7; uVar6 = uVar6 + 1) {
          pVVar11 = (Var *)((ulong)pVVar11 | (ulong)(uint)(1 << ((byte)uVar6 & 0x1f)));
        }
      }
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)auStack_b8;
      auStack_b8 = (undefined1  [8])pVVar11;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_88,__l_02,
                 (allocator_type *)&local_d8);
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl = auStack_88;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           right_val.
           super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           right_val.
           super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      auStack_88 = (undefined1  [8])0x0;
      right_val.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      right_val.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged = true;
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_88);
      goto LAB_001e06c0;
    }
  }
  else {
    if (pp_Var1 == (_func_int **)0x1c) {
      std::vector<kratos::Var*,std::allocator<kratos::Var*>>::
      vector<__gnu_cxx::__normal_iterator<kratos::Var*const*,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,void>
                ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)local_58,
                 (__normal_iterator<kratos::Var_*const_*,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                  )var[1].super_IRNode.fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (__normal_iterator<kratos::Var_*const_*,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                  )*(Var ***)&var[1].super_IRNode.verilog_ln,(allocator_type *)auStack_88);
      std::
      __reverse<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>>
                (local_58,vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
      pVVar10 = (Var *)0x0;
      iVar12 = 0;
      auVar13 = local_58;
      do {
        if (auVar13 ==
            (undefined1  [8])
            vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)auStack_b8;
          auStack_b8 = (undefined1  [8])pVVar10;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_88,__l_00,
                     (allocator_type *)&local_d8);
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl = auStack_88;
          (__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               right_val.
               super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          (__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               right_val.
               super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          auStack_88 = (undefined1  [8])0x0;
          right_val.
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          right_val.
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_engaged = true;
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_88);
LAB_001e0522:
          std::_Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>::~_Vector_base
                    ((_Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_58);
          return __return_storage_ptr__;
        }
        pVVar11 = *(Var **)auVar13;
        oVar14 = get_value_(this,pVVar11);
        if (((undefined1  [16])
             oVar14.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
            (undefined1  [16])0x0) {
          (__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_engaged = false;
          goto LAB_001e0522;
        }
        iVar5 = (*(pVVar11->super_IRNode)._vptr_IRNode[7])(pVVar11);
        pVVar10 = (Var *)((ulong)pVVar10 |
                         oVar14.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_long>._M_payload <<
                         ((byte)iVar12 & 0x3f));
        iVar12 = iVar12 + iVar5;
        auVar13 = (undefined1  [8])((long)auVar13 + 8);
      } while( true );
    }
    get_complex_value_((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                       local_58,this,
                       (Var *)var[1].super_IRNode.fn_name_ln.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    if ((char)vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != '\0') {
      get_complex_value_((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                         auStack_88,this,
                         (Var *)var[1].super_IRNode.fn_name_ln.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
      bVar4 = is_ternary_op((ExprOp)var[1].super_IRNode._vptr_IRNode);
      if (bVar4) {
        get_complex_value_((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                           auStack_b8,this,
                           (Var *)var[1].super_IRNode.fn_name_ln.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (predicate_val.
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_payload.field2[0x10] == '\0') {
          std::
          _Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>::
          _Optional_base(&__return_storage_ptr__->
                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                         ,(_Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                           *)auStack_88);
        }
        else {
          uVar2 = *(unsigned_long *)auStack_b8;
          pVVar10 = *(Var **)local_58;
          uVar3 = *(uint64_t *)auStack_88;
          uVar8 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
          local_90 = eval_ternary_op(uVar2 != 0,(uint64_t)pVVar10,uVar3,uVar8);
          __l._M_len = 1;
          __l._M_array = &local_90;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,__l,
                     &local_31);
          *(pointer *)
           &(__return_storage_ptr__->
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl = local_d8._M_impl.super__Vector_impl_data._M_start;
          (__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_d8._M_impl.super__Vector_impl_data._M_finish;
          (__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_d8._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_engaged = true;
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d8)
          ;
        }
        std::_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
        _M_reset((_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)auStack_b8);
      }
      else {
        bVar4 = is_unary_op((ExprOp)var[1].super_IRNode._vptr_IRNode);
        if (bVar4) {
          pVVar10 = *(Var **)local_58;
          pp_Var1 = var[1].super_IRNode._vptr_IRNode;
          uVar8 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
          local_d8._M_impl.super__Vector_impl_data._M_start =
               (pointer)eval_unary_op((uint64_t)pVVar10,(ExprOp)pp_Var1,uVar8);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&local_d8;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_b8,__l_01,
                     (allocator_type *)&local_90);
        }
        else {
          if (right_val.
              super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ._M_payload.field2[0x10] == '\0') {
            (__return_storage_ptr__->
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_engaged = false;
            goto LAB_001e06b7;
          }
          if (8 < (ulong)((long)vars.
                                super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                                _M_impl.super__Vector_impl_data._M_start - (long)local_58)) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar9,"Not implemented");
LAB_001e0744:
            __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if (8 < (ulong)((long)right_val.
                                super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                ._M_payload._M_value.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start - (long)auStack_88)) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar9,"Not implemented");
            goto LAB_001e0744;
          }
          pVVar10 = *(Var **)local_58;
          uVar3 = *(uint64_t *)auStack_88;
          pp_Var1 = var[1].super_IRNode._vptr_IRNode;
          uVar8 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
          local_d8._M_impl.super__Vector_impl_data._M_start =
               (pointer)eval_bin_op((uint64_t)pVVar10,uVar3,(ExprOp)pp_Var1,uVar8,var->is_signed_);
          __l_03._M_len = 1;
          __l_03._M_array = (iterator)&local_d8;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_b8,__l_03,
                     (allocator_type *)&local_90);
        }
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl = auStack_b8;
        (__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             predicate_val.
             super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             predicate_val.
             super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        auStack_b8 = (undefined1  [8])0x0;
        predicate_val.
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        predicate_val.
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_engaged = true;
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_b8);
      }
LAB_001e06b7:
      std::_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
      _M_reset((_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)auStack_88);
      goto LAB_001e06c0;
    }
  }
  std::_Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>::
  _Optional_base(&__return_storage_ptr__->
                  super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                 ,(_Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                   *)local_58);
LAB_001e06c0:
  std::_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::_M_reset
            ((_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             local_58);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<uint64_t>> Simulator::eval_expr(const kratos::Var *var) const {
    if (var->type() == VarType::Expression) {
        const auto *expr = reinterpret_cast<const Expr *>(var);
        // there are couple special ones
        if (expr->op == ExprOp::Concat) {
            const auto *var_concat = reinterpret_cast<const VarConcat *>(expr);
            auto vars = std::vector<Var *>(var_concat->vars().begin(), var_concat->vars().end());
            std::reverse(vars.begin(), vars.end());
            uint32_t shift_amount = 0;
            uint64_t value = 0;
            for (auto *var_ : vars) {
                auto v = get_value_(var_);
                if (v) {
                    value |= (*v) << shift_amount;
                    shift_amount += var_->width();
                } else {
                    return std::nullopt;
                }
            }
            return std::vector<uint64_t>{value};
        } else if (expr->op == ExprOp::Extend) {
            // depends on whether it's a signed value or not
            const auto *extend = reinterpret_cast<const VarExtend *>(var);
            auto *base_var = extend->parent_var();
            auto value = get_complex_value_(base_var);
            if (!value) return std::nullopt;
            if (var->is_signed()) {
                // do signed extension
                if ((*value).size() > 1) {
                    throw std::runtime_error("Not implemented");
                }
                auto v = (*value)[0];
                if (v >> (var->width() - 1)) {
                    // do a signed extension
                    for (uint32_t i = base_var->width(); i < var->width(); i++) {
                        v |= 1u << i;
                    }
                }
                return std::vector<uint64_t>{v};
            } else {
                return value;
            }
        } else {
            auto left_val = get_complex_value_(expr->left);
            if (!left_val) return left_val;
            auto right_val = get_complex_value_(expr->right);
            if (is_ternary_op(expr->op)) {
                auto const *cond = reinterpret_cast<const ConditionalExpr *>(expr);
                auto predicate_val = get_complex_value_(cond->condition);
                if (!predicate_val) return right_val;
                bool c = (*predicate_val)[0];
                auto result = eval_ternary_op(c, (*left_val)[0], (*right_val)[0], expr->width());
                return std::vector<uint64_t>{result};
            } else if (!is_unary_op(expr->op)) {
                if (!right_val) return std::nullopt;
                if ((*left_val).size() > 1) throw std::runtime_error("Not implemented");
                if ((*right_val).size() > 1) throw std::runtime_error("Not implemented");
                auto left_value = (*left_val)[0];
                auto right_value = (*right_val)[0];
                auto result = eval_bin_op(left_value, right_value, expr->op, expr->width(),
                                          expr->is_signed());
                return std::vector<uint64_t>{result};
            } else {
                auto left_value = (*left_val)[0];
                auto result = eval_unary_op(left_value, expr->op, expr->width());
                return std::vector<uint64_t>{result};
            }
        }

    } else {
        return get_complex_value_(var);
    }
}